

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTFWrapper.cpp
# Opt level: O2

bool __thiscall
llvm::ConvertUTF8toWide
          (llvm *this,uint WideCharWidth,StringRef Source,char **ResultPtr,UTF8 **ErrorPtr)

{
  uint __line;
  Boolean BVar1;
  ConversionResult CVar2;
  long *plVar3;
  undefined4 in_register_00000034;
  UTF8 *__src;
  int iVar4;
  char *pcVar5;
  UTF8 *sourceStart;
  UTF32 *targetStart;
  
  __src = (UTF8 *)CONCAT44(in_register_00000034,WideCharWidth);
  plVar3 = (long *)Source.Length;
  pcVar5 = Source.Data;
  iVar4 = (int)this;
  if (iVar4 == 1) {
    sourceStart = __src;
    BVar1 = isLegalUTF8String(&sourceStart,__src + (long)pcVar5);
    if (BVar1 == '\0') {
      *ResultPtr = (char *)sourceStart;
      CVar2 = sourceIllegal;
    }
    else {
      memcpy((void *)*plVar3,__src,(size_t)pcVar5);
      *plVar3 = (long)(pcVar5 + *plVar3);
      CVar2 = conversionOK;
    }
  }
  else {
    if (iVar4 == 2) {
      targetStart = (UTF32 *)*plVar3;
      sourceStart = __src;
      CVar2 = ConvertUTF8toUTF16(&sourceStart,__src + (long)pcVar5,(UTF16 **)&targetStart,
                                 (UTF16 *)((long)targetStart + (long)pcVar5 * 2),strictConversion);
    }
    else {
      if (iVar4 != 4) {
        pcVar5 = "WideCharWidth == 1 || WideCharWidth == 2 || WideCharWidth == 4";
        __line = 0x16;
        goto LAB_0015f461;
      }
      targetStart = (UTF32 *)*plVar3;
      sourceStart = __src;
      CVar2 = ConvertUTF8toUTF32(&sourceStart,__src + (long)pcVar5,&targetStart,
                                 targetStart + (long)pcVar5,strictConversion);
    }
    if (CVar2 == conversionOK) {
      *plVar3 = (long)targetStart;
    }
    else {
      *ResultPtr = (char *)sourceStart;
    }
    if (CVar2 == targetExhausted) {
      pcVar5 = "(result != targetExhausted) && \"ConvertUTF8toUTFXX exhausted target buffer\"";
      __line = 0x3e;
LAB_0015f461:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/ConvertUTFWrapper.cpp"
                    ,__line,
                    "bool llvm::ConvertUTF8toWide(unsigned int, llvm::StringRef, char *&, const UTF8 *&)"
                   );
    }
  }
  return CVar2 == conversionOK;
}

Assistant:

bool ConvertUTF8toWide(unsigned WideCharWidth, llvm::StringRef Source,
                       char *&ResultPtr, const UTF8 *&ErrorPtr) {
  assert(WideCharWidth == 1 || WideCharWidth == 2 || WideCharWidth == 4);
  ConversionResult result = conversionOK;
  // Copy the character span over.
  if (WideCharWidth == 1) {
    const UTF8 *Pos = reinterpret_cast<const UTF8*>(Source.begin());
    if (!isLegalUTF8String(&Pos, reinterpret_cast<const UTF8*>(Source.end()))) {
      result = sourceIllegal;
      ErrorPtr = Pos;
    } else {
      memcpy(ResultPtr, Source.data(), Source.size());
      ResultPtr += Source.size();
    }
  } else if (WideCharWidth == 2) {
    const UTF8 *sourceStart = (const UTF8*)Source.data();
    // FIXME: Make the type of the result buffer correct instead of
    // using reinterpret_cast.
    UTF16 *targetStart = reinterpret_cast<UTF16*>(ResultPtr);
    ConversionFlags flags = strictConversion;
    result = ConvertUTF8toUTF16(
        &sourceStart, sourceStart + Source.size(),
        &targetStart, targetStart + Source.size(), flags);
    if (result == conversionOK)
      ResultPtr = reinterpret_cast<char*>(targetStart);
    else
      ErrorPtr = sourceStart;
  } else if (WideCharWidth == 4) {
    const UTF8 *sourceStart = (const UTF8*)Source.data();
    // FIXME: Make the type of the result buffer correct instead of
    // using reinterpret_cast.
    UTF32 *targetStart = reinterpret_cast<UTF32*>(ResultPtr);
    ConversionFlags flags = strictConversion;
    result = ConvertUTF8toUTF32(
        &sourceStart, sourceStart + Source.size(),
        &targetStart, targetStart + Source.size(), flags);
    if (result == conversionOK)
      ResultPtr = reinterpret_cast<char*>(targetStart);
    else
      ErrorPtr = sourceStart;
  }
  assert((result != targetExhausted)
         && "ConvertUTF8toUTFXX exhausted target buffer");
  return result == conversionOK;
}